

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O2

void __thiscall
wasm::
InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
::erase(InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
        *this,HeapType *k)

{
  iterator __it;
  
  __it = std::
         _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this,k);
  if (__it.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__cxx11::
    list<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>
    ::erase(&this->List,
            *(_List_node_base **)
             ((long)__it.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>,_true>
                    ._M_cur + 0x10));
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::erase((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)this,(const_iterator)
                    __it.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>,_true>
                    ._M_cur);
    return;
  }
  return;
}

Assistant:

void erase(const Key& k) {
    auto it = Map.find(k);
    if (it != Map.end()) {
      List.erase(it->second);
      Map.erase(it);
    }
  }